

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

void __thiscall adjMaxtrix<char>::~adjMaxtrix(adjMaxtrix<char> *this)

{
  size_type sVar1;
  int local_14;
  int i;
  adjMaxtrix<char> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
    if (sVar1 <= (ulong)(long)local_14) break;
    if (this->edge[local_14] != (int *)0x0) {
      operator_delete__(this->edge[local_14]);
    }
    local_14 = local_14 + 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector(&this->vexs);
  return;
}

Assistant:

adjMaxtrix<dataType>::~adjMaxtrix()
{
	//撤销矩阵
	for (int i = 0; i < vexs.size(); i++)
		delete[] edge[i];
}